

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *window,ImRect *item_rect,ImGuiScrollFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  ImVec2 IVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  ImGuiContext *pIVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  undefined4 uVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar26;
  ImVec2 IVar24;
  undefined1 auVar25 [16];
  ImRect local_40;
  
  pIVar11 = GImGui;
  uVar5 = window->DecoInnerSizeX1;
  uVar7 = window->DecoInnerSizeY1;
  IVar6 = (window->InnerRect).Min;
  IVar24 = (window->InnerRect).Max;
  auVar25._0_4_ = IVar6.x + -1.0 + (float)uVar5;
  auVar25._4_4_ = IVar6.y + -1.0 + (float)uVar7;
  auVar25._8_8_ = 0;
  fVar21 = IVar24.x + 1.0;
  fVar22 = IVar24.y + 1.0;
  uVar17 = flags;
  if ((flags & 0x15U) == 0) {
    uVar17 = (uint)window->ScrollbarX | flags;
  }
  auVar8._4_4_ = fVar22;
  auVar8._0_4_ = fVar21;
  auVar8._8_8_ = 0;
  auVar25 = minps(auVar25,auVar8);
  if ((uVar17 & 0x2a) == 0) {
    uVar10 = 2;
    if (window->Appearing != false) {
      uVar10 = 0x20;
    }
    uVar17 = uVar17 | uVar10;
  }
  fVar1 = (item_rect->Max).x;
  fVar19 = (item_rect->Min).x;
  fVar20 = (item_rect->Min).y;
  fVar23 = auVar25._0_4_;
  fVar26 = auVar25._4_4_;
  iVar18 = -(uint)(fVar26 <= fVar20);
  auVar9._4_4_ = -(uint)(fVar23 <= fVar19);
  auVar9._0_4_ = -(uint)(fVar23 <= fVar19);
  auVar9._8_4_ = iVar18;
  auVar9._12_4_ = iVar18;
  uVar15 = movmskpd((int)item_rect,auVar9);
  fVar2 = (item_rect->Max).y;
  fVar3 = (GImGui->Style).ItemSpacing.x;
  bVar16 = 1;
  bVar13 = 1;
  if ((fVar21 - fVar23 < fVar3 + fVar3 + (fVar1 - fVar19)) && (window->AutoFitFramesX < '\x01')) {
    bVar13 = ((byte)window->Flags & 0x40) >> 6;
  }
  bVar12 = fVar1 <= fVar21 & (byte)uVar15;
  fVar4 = (GImGui->Style).ItemSpacing.y;
  if ((fVar22 - fVar26 < fVar4 + fVar4 + (fVar2 - fVar20)) && (window->AutoFitFramesY < '\x01')) {
    bVar16 = ((byte)window->Flags & 0x40) >> 6;
  }
  bVar14 = (byte)uVar15 >> 1 & fVar2 <= fVar22;
  if ((uVar17 & 1) == 0 || bVar12 != 0) {
    if ((((uVar17 & 4) == 0 | bVar12) & (uVar17 & 0x10) == 0) == 0) {
      if (bVar13 == 0) goto LAB_00164453;
      fVar21 = 0.5;
      fVar19 = (float)(int)((fVar19 + fVar1) * 0.5);
LAB_00164456:
      SetScrollFromPosX(window,fVar19 - (window->Pos).x,fVar21);
    }
  }
  else {
    if ((fVar23 <= fVar19 & bVar13) == 0) {
      fVar19 = fVar19 - fVar3;
LAB_00164453:
      fVar21 = 0.0;
      goto LAB_00164456;
    }
    if (fVar21 <= fVar1) {
      fVar19 = fVar1 + fVar3;
      fVar21 = 1.0;
      goto LAB_00164456;
    }
  }
  if ((uVar17 & 2) == 0 || bVar14 != 0) {
    if ((((uVar17 & 8) == 0 | bVar14) & (uVar17 & 0x20) == 0) != 0) goto LAB_00164502;
    fVar21 = (item_rect->Min).y;
    fVar22 = 0.0;
    if (bVar16 != 0) {
      fVar22 = 0.5;
      fVar21 = (float)(int)((fVar21 + (item_rect->Max).y) * 0.5);
    }
  }
  else {
    fVar21 = (item_rect->Min).y;
    if ((fVar26 <= fVar21 & bVar16) == 0) {
      fVar21 = fVar21 - (pIVar11->Style).ItemSpacing.y;
      fVar22 = 0.0;
    }
    else {
      fVar21 = (item_rect->Max).y;
      if (fVar21 < fVar22) goto LAB_00164502;
      fVar21 = fVar21 + (pIVar11->Style).ItemSpacing.y;
      fVar22 = 1.0;
    }
  }
  SetScrollFromPosY(window,fVar21 - (window->Pos).y,fVar22);
LAB_00164502:
  IVar6 = CalcNextScrollFromScrollTargetAndClamp(window);
  IVar24.x = IVar6.x - (window->Scroll).x;
  IVar24.y = IVar6.y - (window->Scroll).y;
  if (((uVar17 & 0x40) == 0) && ((window->Flags & 0x1000000) != 0)) {
    uVar17 = (flags & 0xffffffeaU) + 1;
    if ((flags & 0x14U) == 0) {
      uVar17 = flags;
    }
    uVar10 = uVar17 & 0xffffffc1 | 2;
    if ((uVar17 & 0x28) == 0) {
      uVar10 = uVar17;
    }
    local_40.Min.x = (item_rect->Min).x - IVar24.x;
    local_40.Min.y = (item_rect->Min).y - IVar24.y;
    local_40.Max.x = (item_rect->Max).x - IVar24.x;
    local_40.Max.y = (item_rect->Max).y - IVar24.y;
    IVar6 = ScrollToRectEx(window->ParentWindow,&local_40,uVar10);
    IVar24.x = IVar24.x + IVar6.x;
    IVar24.y = IVar24.y + IVar6.y;
  }
  return IVar24;
}

Assistant:

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow* window, const ImRect& item_rect, ImGuiScrollFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImRect scroll_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    scroll_rect.Min.x = ImMin(scroll_rect.Min.x + window->DecoInnerSizeX1, scroll_rect.Max.x);
    scroll_rect.Min.y = ImMin(scroll_rect.Min.y + window->DecoInnerSizeY1, scroll_rect.Max.y);
    //GetForegroundDrawList(window)->AddRect(item_rect.Min, item_rect.Max, IM_COL32(255,0,0,255), 0.0f, 0, 5.0f); // [DEBUG]
    //GetForegroundDrawList(window)->AddRect(scroll_rect.Min, scroll_rect.Max, IM_COL32_WHITE); // [DEBUG]

    // Check that only one behavior is selected per axis
    IM_ASSERT((flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_));
    IM_ASSERT((flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_));

    // Defaults
    ImGuiScrollFlags in_flags = flags;
    if ((flags & ImGuiScrollFlags_MaskX_) == 0 && window->ScrollbarX)
        flags |= ImGuiScrollFlags_KeepVisibleEdgeX;
    if ((flags & ImGuiScrollFlags_MaskY_) == 0)
        flags |= window->Appearing ? ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeY;

    const bool fully_visible_x = item_rect.Min.x >= scroll_rect.Min.x && item_rect.Max.x <= scroll_rect.Max.x;
    const bool fully_visible_y = item_rect.Min.y >= scroll_rect.Min.y && item_rect.Max.y <= scroll_rect.Max.y;
    const bool can_be_fully_visible_x = (item_rect.GetWidth() + g.Style.ItemSpacing.x * 2.0f) <= scroll_rect.GetWidth() || (window->AutoFitFramesX > 0) || (window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0;
    const bool can_be_fully_visible_y = (item_rect.GetHeight() + g.Style.ItemSpacing.y * 2.0f) <= scroll_rect.GetHeight() || (window->AutoFitFramesY > 0) || (window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0;

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeX) && !fully_visible_x)
    {
        if (item_rect.Min.x < scroll_rect.Min.x || !can_be_fully_visible_x)
            SetScrollFromPosX(window, item_rect.Min.x - g.Style.ItemSpacing.x - window->Pos.x, 0.0f);
        else if (item_rect.Max.x >= scroll_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x + g.Style.ItemSpacing.x - window->Pos.x, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterX) && !fully_visible_x) || (flags & ImGuiScrollFlags_AlwaysCenterX))
    {
        if (can_be_fully_visible_x)
            SetScrollFromPosX(window, ImTrunc((item_rect.Min.x + item_rect.Max.x) * 0.5f) - window->Pos.x, 0.5f);
        else
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x, 0.0f);
    }

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeY) && !fully_visible_y)
    {
        if (item_rect.Min.y < scroll_rect.Min.y || !can_be_fully_visible_y)
            SetScrollFromPosY(window, item_rect.Min.y - g.Style.ItemSpacing.y - window->Pos.y, 0.0f);
        else if (item_rect.Max.y >= scroll_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y + g.Style.ItemSpacing.y - window->Pos.y, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterY) && !fully_visible_y) || (flags & ImGuiScrollFlags_AlwaysCenterY))
    {
        if (can_be_fully_visible_y)
            SetScrollFromPosY(window, ImTrunc((item_rect.Min.y + item_rect.Max.y) * 0.5f) - window->Pos.y, 0.5f);
        else
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y, 0.0f);
    }

    ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
    ImVec2 delta_scroll = next_scroll - window->Scroll;

    // Also scroll parent window to keep us into view if necessary
    if (!(flags & ImGuiScrollFlags_NoScrollParent) && (window->Flags & ImGuiWindowFlags_ChildWindow))
    {
        // FIXME-SCROLL: May be an option?
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterX | ImGuiScrollFlags_KeepVisibleCenterX)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskX_) | ImGuiScrollFlags_KeepVisibleEdgeX;
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterY | ImGuiScrollFlags_KeepVisibleCenterY)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskY_) | ImGuiScrollFlags_KeepVisibleEdgeY;
        delta_scroll += ScrollToRectEx(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll), in_flags);
    }

    return delta_scroll;
}